

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

size_t SSL_get0_certificate_types(SSL *ssl,uint8_t **out_types)

{
  bool bVar1;
  pointer pSVar2;
  uchar *puVar3;
  size_t sVar4;
  uchar *local_38;
  uchar *local_30;
  undefined1 local_28 [8];
  Span<const_unsigned_char> types;
  uint8_t **out_types_local;
  SSL *ssl_local;
  
  types.size_ = (size_t)out_types;
  bssl::Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)local_28);
  if (((ssl->field_0xa4 & 1) == 0) && (bVar1 = std::operator!=(&ssl->s3->hs,(nullptr_t)0x0), bVar1))
  {
    pSVar2 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->(&ssl->s3->hs)
    ;
    bssl::Span<unsigned_char_const>::
    Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_38,&pSVar2->certificate_types);
    local_28 = (undefined1  [8])local_38;
    types.data_ = local_30;
  }
  puVar3 = bssl::Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_28);
  *(uchar **)types.size_ = puVar3;
  sVar4 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_28);
  return sVar4;
}

Assistant:

size_t SSL_get0_certificate_types(const SSL *ssl, const uint8_t **out_types) {
  Span<const uint8_t> types;
  if (!ssl->server && ssl->s3->hs != nullptr) {
    types = ssl->s3->hs->certificate_types;
  }
  *out_types = types.data();
  return types.size();
}